

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O0

int __thiscall crnlib::rg_etc1::etc1_optimizer::init(etc1_optimizer *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  uint *puVar2;
  results *in_RDX;
  vec3F *this_00;
  float fVar3;
  uint local_50;
  undefined1 local_4c [4];
  uint i_1;
  vec3F fc;
  color_quad_u8 *c;
  undefined1 auStack_30 [4];
  uint i;
  vec3F avg_color;
  uint n;
  results *r_local;
  params *p_local;
  etc1_optimizer *this_local;
  
  this->m_pParams = (params *)ctx;
  this->m_pResult = in_RDX;
  avg_color.m_s[1] = 1.12104e-44;
  iVar1 = 0x1f;
  if ((this->m_pParams->m_use_color4 & 1U) != 0) {
    iVar1 = 0xf;
  }
  this->m_limit = iVar1;
  vec3F::vec3F((vec3F *)auStack_30,0.0);
  for (c._4_4_ = 0; c._4_4_ < 8; c._4_4_ = c._4_4_ + 1) {
    fc.m_s._4_8_ = this->m_pParams->m_pSrc_pixels + c._4_4_;
    vec3F::vec3F((vec3F *)local_4c,(float)(((color_quad_u8 *)fc.m_s._4_8_)->field_0).field_0.r,
                 (float)(((color_quad_u8 *)fc.m_s._4_8_)->field_0).field_0.g,
                 (float)(((color_quad_u8 *)fc.m_s._4_8_)->field_0).field_0.b);
    vec3F::operator+=((vec3F *)auStack_30,(vec3F *)local_4c);
    this->m_luma[c._4_4_] =
         (ushort)*(byte *)fc.m_s._4_8_ + (ushort)*(byte *)(fc.m_s._4_8_ + 1) +
         (ushort)*(byte *)(fc.m_s._4_8_ + 2);
    this->m_sorted_luma[0][c._4_4_] = c._4_4_;
  }
  vec3F::operator*=((vec3F *)auStack_30,0.125);
  this_00 = &this->m_avg_color;
  (this->m_avg_color).m_s[2] = avg_color.m_s[0];
  *(undefined8 *)(this->m_avg_color).m_s = _auStack_30;
  fVar3 = vec3F::operator[](this_00,0);
  iVar1 = clamp<int>((int)(long)((fVar3 * (float)this->m_limit) / 255.0 + 0.5),0,this->m_limit);
  this->m_br = iVar1;
  fVar3 = vec3F::operator[](this_00,1);
  iVar1 = clamp<int>((int)(long)((fVar3 * (float)this->m_limit) / 255.0 + 0.5),0,this->m_limit);
  this->m_bg = iVar1;
  fVar3 = vec3F::operator[](this_00,2);
  iVar1 = clamp<int>((int)(long)((fVar3 * (float)this->m_limit) / 255.0 + 0.5),0,this->m_limit);
  this->m_bb = iVar1;
  if ((int)(this->m_pParams->super_etc1_pack_params).m_quality < 2) {
    puVar2 = indirect_radix_sort<unsigned_int,unsigned_short>
                       (8,this->m_sorted_luma[0],this->m_sorted_luma[1],this->m_luma,0,2,false);
    this->m_pSorted_luma_indices = puVar2;
    this->m_pSorted_luma = this->m_sorted_luma[0];
    if ((uint32 (*) [8])this->m_pSorted_luma_indices == this->m_sorted_luma) {
      this->m_pSorted_luma = this->m_sorted_luma[1];
    }
    for (local_50 = 0; local_50 < 8; local_50 = local_50 + 1) {
      this->m_pSorted_luma[local_50] = (uint)this->m_luma[this->m_pSorted_luma_indices[local_50]];
    }
  }
  etc1_solution_coordinates::clear(&(this->m_best_solution).m_coords);
  (this->m_best_solution).m_valid = false;
  (this->m_best_solution).m_error = 0xffffffffffffffff;
  return (int)this;
}

Assistant:

void etc1_optimizer::init(const params& p, results& r)
        {
            // This version is hardcoded for 8 pixel subblocks.
            RG_ETC1_ASSERT(p.m_num_src_pixels == 8);

            m_pParams = &p;
            m_pResult = &r;

            const uint n = 8;

            m_limit = m_pParams->m_use_color4 ? 15 : 31;

            vec3F avg_color(0.0f);

            for (uint i = 0; i < n; i++)
            {
                const color_quad_u8& c = m_pParams->m_pSrc_pixels[i];
                const vec3F fc(c.r, c.g, c.b);

                avg_color += fc;

                m_luma[i] = static_cast<uint16>(c.r + c.g + c.b);
                m_sorted_luma[0][i] = i;
            }
            avg_color *= (1.0f / static_cast<float>(n));
            m_avg_color = avg_color;

            m_br = rg_etc1::clamp<int>(static_cast<uint>(m_avg_color[0] * m_limit / 255.0f + .5f), 0, m_limit);
            m_bg = rg_etc1::clamp<int>(static_cast<uint>(m_avg_color[1] * m_limit / 255.0f + .5f), 0, m_limit);
            m_bb = rg_etc1::clamp<int>(static_cast<uint>(m_avg_color[2] * m_limit / 255.0f + .5f), 0, m_limit);

            if (m_pParams->m_quality <= cMediumQuality)
            {
                m_pSorted_luma_indices = indirect_radix_sort(n, m_sorted_luma[0], m_sorted_luma[1], m_luma, 0, sizeof(m_luma[0]), false);
                m_pSorted_luma = m_sorted_luma[0];
                if (m_pSorted_luma_indices == m_sorted_luma[0])
                {
                    m_pSorted_luma = m_sorted_luma[1];
                }

                for (uint i = 0; i < n; i++)
                {
                    m_pSorted_luma[i] = m_luma[m_pSorted_luma_indices[i]];
                }
            }

            m_best_solution.m_coords.clear();
            m_best_solution.m_valid = false;
            m_best_solution.m_error = cUINT64_MAX;
        }